

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O2

char * __thiscall TPZStack<char_*,_10>::Pop(TPZStack<char_*,_10> *this)

{
  long lVar1;
  ostream *poVar2;
  
  lVar1 = (this->super_TPZManVector<char_*,_10>).super_TPZVec<char_*>.fNElements;
  (this->super_TPZManVector<char_*,_10>).super_TPZVec<char_*>.fNElements = lVar1 + -1;
  if (0 < lVar1) {
    return (this->super_TPZManVector<char_*,_10>).super_TPZVec<char_*>.fStore[lVar1 + -1];
  }
  (this->super_TPZManVector<char_*,_10>).super_TPZVec<char_*>.fNElements = 0;
  poVar2 = std::operator<<((ostream *)&std::cerr,"TPZStack popping beyond the stack object");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  return (char *)0x0;
}

Assistant:

T TPZStack<T, NumExtAlloc>::Pop() {
	this->fNElements--;
	if(this->fNElements <0){
		this->fNElements = 0;
		PZError << "TPZStack popping beyond the stack object" << std::endl;
		PZError.flush();
		T temp(0);
		return temp;
	}
	return this->fStore[this->fNElements];
}